

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalOpen(sqlite3_vfs *pVfs,sqlite3_file *pDbFd,char *zWalName,int bNoShm,i64 mxWalSize,
                  Wal **ppWal)

{
  u8 uVar1;
  uint uVar2;
  uint local_54;
  int iDC;
  int flags;
  Wal *pRet;
  Wal **ppWStack_40;
  int rc;
  Wal **ppWal_local;
  i64 mxWalSize_local;
  char *pcStack_28;
  int bNoShm_local;
  char *zWalName_local;
  sqlite3_file *pDbFd_local;
  sqlite3_vfs *pVfs_local;
  
  *ppWal = (Wal *)0x0;
  ppWStack_40 = ppWal;
  ppWal_local = (Wal **)mxWalSize;
  mxWalSize_local._4_4_ = bNoShm;
  pcStack_28 = zWalName;
  zWalName_local = (char *)pDbFd;
  pDbFd_local = (sqlite3_file *)pVfs;
  _iDC = (Wal *)sqlite3MallocZero((long)pVfs->szOsFile + 0x90);
  if (_iDC == (Wal *)0x0) {
    pVfs_local._4_4_ = 7;
  }
  else {
    _iDC->pVfs = (sqlite3_vfs *)pDbFd_local;
    _iDC->pWalFd = (sqlite3_file *)(_iDC + 1);
    _iDC->pDbFd = (sqlite3_file *)zWalName_local;
    _iDC->readLock = -1;
    _iDC->mxWalSize = (i64)ppWal_local;
    _iDC->zWalName = pcStack_28;
    _iDC->syncHeader = '\x01';
    _iDC->padToSectorBoundary = '\x01';
    uVar1 = '\0';
    if (mxWalSize_local._4_4_ != 0) {
      uVar1 = '\x02';
    }
    _iDC->exclusiveMode = uVar1;
    local_54 = 0x80006;
    pRet._4_4_ = sqlite3OsOpen((sqlite3_vfs *)pDbFd_local,pcStack_28,_iDC->pWalFd,0x80006,
                               (int *)&local_54);
    if ((pRet._4_4_ == 0) && ((local_54 & 1) != 0)) {
      _iDC->readOnly = '\x01';
    }
    if (pRet._4_4_ == 0) {
      uVar2 = sqlite3OsDeviceCharacteristics((sqlite3_file *)zWalName_local);
      if ((uVar2 & 0x400) != 0) {
        _iDC->syncHeader = '\0';
      }
      if ((uVar2 & 0x1000) != 0) {
        _iDC->padToSectorBoundary = '\0';
      }
      *ppWStack_40 = _iDC;
    }
    else {
      walIndexClose(_iDC,0);
      sqlite3OsClose(_iDC->pWalFd);
      sqlite3_free(_iDC);
    }
    pVfs_local._4_4_ = pRet._4_4_;
  }
  return pVfs_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalOpen(
  sqlite3_vfs *pVfs,              /* vfs module to open wal and wal-index */
  sqlite3_file *pDbFd,            /* The open database file */
  const char *zWalName,           /* Name of the WAL file */
  int bNoShm,                     /* True to run in heap-memory mode */
  i64 mxWalSize,                  /* Truncate WAL to this size on reset */
  Wal **ppWal                     /* OUT: Allocated Wal handle */
){
  int rc;                         /* Return Code */
  Wal *pRet;                      /* Object to allocate and return */
  int flags;                      /* Flags passed to OsOpen() */

  assert( zWalName && zWalName[0] );
  assert( pDbFd );

  /* In the amalgamation, the os_unix.c and os_win.c source files come before
  ** this source file.  Verify that the #defines of the locking byte offsets
  ** in os_unix.c and os_win.c agree with the WALINDEX_LOCK_OFFSET value.
  ** For that matter, if the lock offset ever changes from its initial design
  ** value of 120, we need to know that so there is an assert() to check it.
  */
  assert( 120==WALINDEX_LOCK_OFFSET );
  assert( 136==WALINDEX_HDR_SIZE );
#ifdef WIN_SHM_BASE
  assert( WIN_SHM_BASE==WALINDEX_LOCK_OFFSET );
#endif
#ifdef UNIX_SHM_BASE
  assert( UNIX_SHM_BASE==WALINDEX_LOCK_OFFSET );
#endif


  /* Allocate an instance of struct Wal to return. */
  *ppWal = 0;
  pRet = (Wal*)sqlite3MallocZero(sizeof(Wal) + pVfs->szOsFile);
  if( !pRet ){
    return SQLITE_NOMEM_BKPT;
  }

  pRet->pVfs = pVfs;
  pRet->pWalFd = (sqlite3_file *)&pRet[1];
  pRet->pDbFd = pDbFd;
  pRet->readLock = -1;
  pRet->mxWalSize = mxWalSize;
  pRet->zWalName = zWalName;
  pRet->syncHeader = 1;
  pRet->padToSectorBoundary = 1;
  pRet->exclusiveMode = (bNoShm ? WAL_HEAPMEMORY_MODE: WAL_NORMAL_MODE);

  /* Open file handle on the write-ahead log file. */
  flags = (SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|SQLITE_OPEN_WAL);
  rc = sqlite3OsOpen(pVfs, zWalName, pRet->pWalFd, flags, &flags);
  if( rc==SQLITE_OK && flags&SQLITE_OPEN_READONLY ){
    pRet->readOnly = WAL_RDONLY;
  }

  if( rc!=SQLITE_OK ){
    walIndexClose(pRet, 0);
    sqlite3OsClose(pRet->pWalFd);
    sqlite3_free(pRet);
  }else{
    int iDC = sqlite3OsDeviceCharacteristics(pDbFd);
    if( iDC & SQLITE_IOCAP_SEQUENTIAL ){ pRet->syncHeader = 0; }
    if( iDC & SQLITE_IOCAP_POWERSAFE_OVERWRITE ){
      pRet->padToSectorBoundary = 0;
    }
    *ppWal = pRet;
    WALTRACE(("WAL%d: opened\n", pRet));
  }
  return rc;
}